

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureTransform.cpp
# Opt level: O1

void __thiscall Assimp::TextureTransformStep::Execute(TextureTransformStep *this,aiScene *pScene)

{
  _List_node_base **pp_Var1;
  aiVector3D **ppaVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  aiMaterial *paVar6;
  aiVector2D *paVar7;
  aiMesh *paVar8;
  aiVector3D *__dest;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  bool bVar15;
  bool bVar16;
  uint n;
  int iVar17;
  uint uVar18;
  int iVar19;
  Logger *pLVar20;
  _List_node_base *p_Var21;
  _List_node_base *p_Var22;
  _Node *p_Var23;
  _List_node_base *p_Var24;
  _List_node_base *p_Var25;
  aiVector3D *paVar26;
  bool bVar27;
  uint uVar28;
  char *pcVar29;
  _List_node_base *p_Var30;
  uint uVar31;
  ulong uVar32;
  TextureTransformStep *this_00;
  TextureTransformStep *__s1;
  TextureTransformStep *pTVar33;
  char *pcVar34;
  long lVar35;
  ulong uVar36;
  list<Assimp::STransformVecInfo,std::allocator<Assimp::STransformVecInfo>> *plVar37;
  ulong uVar38;
  list<Assimp::STransformVecInfo,std::allocator<Assimp::STransformVecInfo>> *plVar39;
  iterator __position;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  bool ref [8];
  vector<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
  meshLists;
  aiVector3D *old [8];
  char buffer [1024];
  uint local_64c;
  _List_node_base *local_648;
  uint local_5fc;
  char acStack_5f8 [8];
  char *local_5f0;
  char local_5e0 [16];
  vector<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
  local_5d0;
  _List_node_base local_5b8;
  ai_real local_5a8;
  uint uStack_5a4;
  aiTextureMapMode aStack_5a0;
  aiTextureMapMode aStack_59c;
  uint uStack_598;
  undefined4 uStack_594;
  _List_node_base *p_Stack_590;
  _List_node_base *local_588;
  _List_node_base *p_Stack_580;
  ios_base local_548 [272];
  STransformVecInfo local_438 [16];
  
  pLVar20 = DefaultLogger::get();
  Logger::debug(pLVar20,"TransformUVCoordsProcess begin");
  std::
  vector<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
  ::vector(&local_5d0,(ulong)pScene->mNumMeshes,(allocator_type *)local_438);
  if (pScene->mNumMaterials != 0) {
    uVar36 = 0;
    do {
      paVar6 = pScene->mMaterials[uVar36];
      if (paVar6->mNumProperties != 0) {
        uVar38 = 0;
        do {
          p_Var22 = (&((_List_node_base *)paVar6->mProperties)->_M_next)[uVar38];
          this_00 = (TextureTransformStep *)((long)&p_Var22->_M_next + 4);
          iVar17 = strcmp((char *)this_00,"$tex.file");
          if (iVar17 == 0) {
            local_438[0].super_aiUVTransform.mTranslation.x = 0.0;
            local_438[0].super_aiUVTransform.mTranslation.y = 0.0;
            local_438[0].super_aiUVTransform.mScaling.x = 1.0;
            local_438[0].super_aiUVTransform.mScaling.y = 1.0;
            local_438[0].super_aiUVTransform.mRotation = 0.0;
            local_438[0].uvIndex = 0;
            local_438[0].mapU = aiTextureMapMode_Wrap;
            local_438[0].mapV = aiTextureMapMode_Wrap;
            local_438[0].lockedPos = 0xeeeeeeee;
            local_438[0].updateList.
            super__List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>._M_impl.
            _M_node.super__List_node_base._M_next = (_List_node_base *)&local_438[0].updateList;
            local_438[0].updateList.
            super__List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>._M_impl.
            _M_node._M_size = 0;
            uVar4 = *(undefined4 *)((long)&p_Var22[0x40]._M_next + 4);
            uVar5 = *(undefined4 *)&p_Var22[0x40]._M_prev;
            local_438[0].updateList.
            super__List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>._M_impl.
            _M_node.super__List_node_base._M_prev =
                 local_438[0].updateList.
                 super__List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>.
                 _M_impl._M_node.super__List_node_base._M_next;
            if (paVar6->mNumProperties == 0) {
              local_648 = (_List_node_base *)0x0;
            }
            else {
              uVar31 = 0;
              local_648 = (_List_node_base *)0x0;
              do {
                uVar32 = (ulong)uVar31;
                pTVar33 = (TextureTransformStep *)
                          (&((_List_node_base *)paVar6->mProperties)->_M_next)[uVar32];
                if ((*(int *)((long)&pTVar33[0x20].super_BaseProcess._vptr_BaseProcess + 4) ==
                     *(int *)((long)&p_Var22[0x40]._M_next + 4)) &&
                   (*(int *)&pTVar33[0x20].super_BaseProcess.shared ==
                    *(int *)&p_Var22[0x40]._M_prev)) {
                  __s1 = (TextureTransformStep *)
                         ((long)&(pTVar33->super_BaseProcess)._vptr_BaseProcess + 4);
                  this_00 = __s1;
                  iVar17 = strcmp((char *)__s1,"$tex.uvwsrc");
                  if (iVar17 == 0) {
                    local_648 = *(_List_node_base **)&pTVar33[0x20].configFlags;
                    local_438[0].uvIndex = *(undefined4 *)&local_648->_M_next;
                  }
                  else {
                    this_00 = __s1;
                    iVar17 = strcmp((char *)__s1,"$tex.mapmodeu");
                    if (iVar17 == 0) {
                      local_438[0].mapU = **(aiTextureMapMode **)&pTVar33[0x20].configFlags;
                    }
                    else {
                      this_00 = __s1;
                      iVar17 = strcmp((char *)__s1,"$tex.mapmodev");
                      if (iVar17 == 0) {
                        local_438[0].mapV = **(aiTextureMapMode **)&pTVar33[0x20].configFlags;
                      }
                      else {
                        iVar17 = strcmp((char *)__s1,"$tex.uvtrafo");
                        this_00 = __s1;
                        if (iVar17 == 0) {
                          if (*(uint *)((long)&pTVar33[0x20].super_BaseProcess.shared + 4) < 0x14) {
                            __assert_fail("prop2->mDataLength >= 20",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/PostProcessing/TextureTransform.cpp"
                                          ,0x10f,
                                          "virtual void Assimp::TextureTransformStep::Execute(aiScene *)"
                                         );
                          }
                          paVar7 = *(aiVector2D **)&pTVar33[0x20].configFlags;
                          local_438[0].super_aiUVTransform.mRotation = paVar7[2].x;
                          local_438[0].super_aiUVTransform.mTranslation = *paVar7;
                          local_438[0].super_aiUVTransform.mScaling = paVar7[1];
                          uVar18 = paVar6->mNumProperties - 1;
                          paVar6->mNumProperties = uVar18;
                          if (uVar31 < uVar18) {
                            do {
                              (&((_List_node_base *)paVar6->mProperties)->_M_next)[uVar32] =
                                   (&((_List_node_base *)paVar6->mProperties)->_M_prev)[uVar32];
                              uVar32 = uVar32 + 1;
                            } while (uVar32 < paVar6->mNumProperties);
                          }
                          if (pTVar33 != (TextureTransformStep *)0x0) {
                            if (*(void **)&pTVar33[0x20].configFlags != (void *)0x0) {
                              operator_delete__(*(void **)&pTVar33[0x20].configFlags);
                            }
                            *(undefined8 *)&pTVar33[0x20].configFlags = 0;
                            operator_delete(pTVar33);
                            __s1 = pTVar33;
                          }
                          uVar31 = uVar31 - 1;
                          this_00 = __s1;
                        }
                      }
                    }
                  }
                }
                uVar31 = uVar31 + 1;
              } while (uVar31 < paVar6->mNumProperties);
            }
            uVar31 = this->configFlags;
            if ((uVar31 & 2) == 0) {
              local_438[0]._16_8_ = local_438[0]._16_8_ & 0xffffffff00000000;
            }
            if ((uVar31 & 1) == 0) {
              local_438[0].super_aiUVTransform.mScaling.x = 1.0;
              local_438[0].super_aiUVTransform.mScaling.y = 1.0;
            }
            if ((uVar31 & 4) == 0) {
              local_438[0].super_aiUVTransform.mTranslation.x = 0.0;
              local_438[0].super_aiUVTransform.mTranslation.y = 0.0;
            }
            PreProcessUVTransform(this_00,local_438);
            uVar31 = local_438[0].uvIndex;
            if (6 < local_438[0].uvIndex) {
              uVar31 = 7;
            }
            local_438[0].uvIndex = uVar31;
            if ((ulong)pScene->mNumMeshes == 0) {
              iVar17 = 0;
            }
            else {
              uVar32 = 0;
              iVar17 = 0;
              do {
                iVar17 = iVar17 + (uint)(uVar36 == pScene->mMeshes[uVar32]->mMaterialIndex);
                uVar32 = uVar32 + 1;
              } while (pScene->mNumMeshes != uVar32);
            }
            if (iVar17 == 0) {
              p_Var22 = local_438[0].updateList.
                        super__List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>
                        ._M_impl._M_node.super__List_node_base._M_next;
              while (p_Var22 != (_List_node_base *)&local_438[0].updateList) {
                p_Var21 = p_Var22->_M_next;
                operator_delete(p_Var22);
                p_Var22 = p_Var21;
              }
            }
            else {
              if (iVar17 != 1) {
                local_438[0].lockedPos = 0xffffffff;
              }
              if (pScene->mNumMeshes != 0) {
                uVar32 = 0;
                do {
                  paVar8 = pScene->mMeshes[uVar32];
                  if ((uVar36 == paVar8->mMaterialIndex) &&
                     (paVar8->mTextureCoords[0] != (aiVector3D *)0x0)) {
                    uVar31 = local_438[0].uvIndex;
                    if (paVar8->mTextureCoords[local_438[0].uvIndex] == (aiVector3D *)0x0) {
                      uVar31 = 0;
                    }
                    if (paVar8->mNumUVComponents[local_438[0].uvIndex] < 3) {
                      plVar37 = (list<Assimp::STransformVecInfo,std::allocator<Assimp::STransformVecInfo>>
                                 *)(local_5d0.
                                    super__Vector_base<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar32);
                      plVar39 = *(list<Assimp::STransformVecInfo,std::allocator<Assimp::STransformVecInfo>>
                                  **)plVar37;
                      if (plVar39 != plVar37) {
                        do {
                          if ((((ABS(*(float *)(plVar39 + 0x10) -
                                     local_438[0].super_aiUVTransform.mTranslation.x) <= 0.05) &&
                               (ABS(*(float *)(plVar39 + 0x14) -
                                    local_438[0].super_aiUVTransform.mTranslation.y) <= 0.05)) &&
                              (ABS(*(float *)(plVar39 + 0x18) -
                                   local_438[0].super_aiUVTransform.mScaling.x) <= 0.05)) &&
                             (((ABS(*(float *)(plVar39 + 0x1c) -
                                    local_438[0].super_aiUVTransform.mScaling.y) <= 0.05 &&
                               (ABS(*(float *)(plVar39 + 0x20) -
                                    local_438[0].super_aiUVTransform.mRotation) <= 0.05)) &&
                              (*(uint *)(plVar39 + 0x24) == uVar31)))) {
                            p_Var22 = (_List_node_base *)operator_new(0x28);
                            p_Var22[1]._M_next = local_648;
                            p_Var22[1]._M_prev = (_List_node_base *)paVar6;
                            *(undefined4 *)&p_Var22[2]._M_next = uVar4;
                            *(undefined4 *)((long)&p_Var22[2]._M_next + 4) = uVar5;
                            std::__detail::_List_node_base::_M_hook(p_Var22);
                            *(long *)(plVar39 + 0x48) = *(long *)(plVar39 + 0x48) + 1;
                            break;
                          }
                          plVar39 = *(list<Assimp::STransformVecInfo,std::allocator<Assimp::STransformVecInfo>>
                                      **)plVar39;
                        } while (plVar39 != plVar37);
                      }
                      plVar37 = (list<Assimp::STransformVecInfo,std::allocator<Assimp::STransformVecInfo>>
                                 *)(local_5d0.
                                    super__Vector_base<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar32);
                      if (plVar39 == plVar37) {
                        p_Var23 = std::__cxx11::
                                  list<Assimp::STransformVecInfo,std::allocator<Assimp::STransformVecInfo>>
                                  ::_M_create_node<Assimp::STransformVecInfo_const&>
                                            (plVar37,local_438);
                        std::__detail::_List_node_base::_M_hook(&p_Var23->super__List_node_base);
                        *(long *)(plVar37 + 0x10) = *(long *)(plVar37 + 0x10) + 1;
                        *(uint *)((long)&local_5d0.
                                         super__Vector_base<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[uVar32].
                                         super__List_base<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>
                                         ._M_impl._M_node.super__List_node_base._M_prev[2]._M_next +
                                 4) = uVar31;
                        p_Var22 = local_5d0.
                                  super__Vector_base<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar32].
                                  super__List_base<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>
                                  ._M_impl._M_node.super__List_node_base._M_prev;
                        p_Var21 = (_List_node_base *)operator_new(0x28);
                        p_Var21[1]._M_next = local_648;
                        p_Var21[1]._M_prev = (_List_node_base *)paVar6;
                        *(undefined4 *)&p_Var21[2]._M_next = uVar4;
                        *(undefined4 *)((long)&p_Var21[2]._M_next + 4) = uVar5;
                        std::__detail::_List_node_base::_M_hook(p_Var21);
                        pp_Var1 = &p_Var22[4]._M_prev;
                        *pp_Var1 = (_List_node_base *)((long)&(*pp_Var1)->_M_next + 1);
                      }
                    }
                    else {
                      pLVar20 = DefaultLogger::get();
                      Logger::warn(pLVar20,
                                   "UV transformations on 3D mapping channels are not supported");
                    }
                  }
                  uVar32 = uVar32 + 1;
                } while (uVar32 < pScene->mNumMeshes);
              }
              p_Var22 = local_438[0].updateList.
                        super__List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>
                        ._M_impl._M_node.super__List_node_base._M_next;
              while (p_Var22 != (_List_node_base *)&local_438[0].updateList) {
                p_Var21 = (((_List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>
                             *)&p_Var22->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
                operator_delete(p_Var22);
                p_Var22 = p_Var21;
              }
            }
          }
          uVar38 = uVar38 + 1;
        } while (uVar38 < paVar6->mNumProperties);
      }
      uVar36 = uVar36 + 1;
    } while (uVar36 < pScene->mNumMaterials);
  }
  if (pScene->mNumMeshes == 0) {
    iVar17 = 0;
LAB_00161f39:
    bVar16 = DefaultLogger::isNullLogger();
    if (!bVar16) {
      if (iVar17 == 0) {
        pLVar20 = DefaultLogger::get();
        Logger::debug(pLVar20,"TransformUVCoordsProcess finished");
      }
      else {
        pLVar20 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[31]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_5b8,(char (*) [31])"TransformUVCoordsProcess end: ");
        std::ostream::_M_insert<unsigned_long>((ulong)&local_5b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_5b8," output channels (in: ",0x16);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_5b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_5b8,", modified: ",0xc)
        ;
        std::ostream::_M_insert<unsigned_long>((ulong)&local_5b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_5b8,")",1);
        std::__cxx11::stringbuf::str();
        Logger::info(pLVar20,local_5f0);
        if (local_5f0 != local_5e0) {
          operator_delete(local_5f0);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_5b8);
        std::ios_base::~ios_base(local_548);
      }
    }
    std::
    vector<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
    ::~vector(&local_5d0);
    return;
  }
  uVar36 = 0;
  iVar17 = 0;
LAB_00161367:
  paVar8 = pScene->mMeshes[uVar36];
  p_Var22 = (_List_node_base *)
            (local_5d0.
             super__Vector_base<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar36);
  ppaVar2 = paVar8->mTextureCoords;
  lVar35 = 0;
  do {
    if (ppaVar2[lVar35] == (aiVector3D *)0x0) break;
    lVar35 = lVar35 + 1;
  } while (lVar35 != 8);
  if (((*ppaVar2 != (aiVector3D *)0x0) &&
      (__position._M_node = p_Var22->_M_next, __position._M_node != p_Var22)) &&
     ((((p_Var22[1]._M_next != (_List_node_base *)0x1 ||
        (((*(float *)&__position._M_node[1]._M_prev != 1.0 ||
          (NAN(*(float *)&__position._M_node[1]._M_prev))) ||
         (fVar51 = *(float *)((long)&__position._M_node[1]._M_prev + 4), fVar51 != 1.0)))) ||
       ((NAN(fVar51) || (*(float *)&__position._M_node[1]._M_next != 0.0)))) ||
      ((NAN(*(float *)&__position._M_node[1]._M_next) ||
       (((fVar51 = *(float *)((long)&__position._M_node[1]._M_next + 4), fVar51 != 0.0 ||
         (NAN(fVar51))) ||
        (0.008726646 < *(float *)&__position._M_node[2]._M_next ||
         *(float *)&__position._M_node[2]._M_next == 0.008726646)))))))) {
    iVar19 = 0;
    if (__position._M_node == p_Var22) {
      bVar16 = false;
    }
    else {
      bVar27 = false;
      bVar16 = false;
      do {
        bVar11 = *(float *)&__position._M_node[1]._M_prev == 1.0;
        bVar12 = *(float *)((long)&__position._M_node[1]._M_prev + 4) == 1.0;
        bVar9 = *(float *)&__position._M_node[1]._M_next == 0.0;
        bVar10 = *(float *)((long)&__position._M_node[1]._M_next + 4) == 0.0;
        bVar15 = true;
        if (((bVar10 && bVar9) && (bVar11 && bVar12)) &&
           (bVar15 = bVar16,
           0.008726646 < *(float *)&__position._M_node[2]._M_next ||
           *(float *)&__position._M_node[2]._M_next == 0.008726646)) {
          bVar15 = true;
        }
        bVar16 = bVar15;
        if (*(int *)&__position._M_node[3]._M_next == -1) {
          *(int *)&__position._M_node[3]._M_next = iVar19;
          bVar27 = true;
        }
        else if (((!bVar27) &&
                 (p_Var21 = p_Var22->_M_next,
                 ((bVar10 && bVar9) && (bVar11 && bVar12)) && __position._M_node != p_Var21)) &&
                (*(float *)&__position._M_node[2]._M_next <= 0.008726646 &&
                 *(float *)&__position._M_node[2]._M_next != 0.008726646)) goto LAB_0016150c;
        __position._M_node = (__position._M_node)->_M_next;
        iVar19 = iVar19 + 1;
      } while (__position._M_node != p_Var22);
    }
    goto LAB_00161589;
  }
  lVar35 = 0;
  do {
    if (ppaVar2[lVar35] == (aiVector3D *)0x0) break;
    lVar35 = lVar35 + 1;
  } while (lVar35 != 8);
  goto LAB_00161f06;
LAB_0016150c:
  while ((((p_Var21 != __position._M_node && (*(float *)&p_Var21[1]._M_prev == 1.0)) &&
          ((!NAN(*(float *)&p_Var21[1]._M_prev) &&
           ((fVar51 = *(float *)((long)&p_Var21[1]._M_prev + 4), fVar51 == 1.0 && (!NAN(fVar51))))))
          ) && ((*(float *)&p_Var21[1]._M_next == 0.0 &&
                ((((!NAN(*(float *)&p_Var21[1]._M_next) &&
                   (fVar51 = *(float *)((long)&p_Var21[1]._M_next + 4), fVar51 == 0.0)) &&
                  (!NAN(fVar51))) &&
                 (*(float *)&p_Var21[2]._M_next <= 0.008726646 &&
                  *(float *)&p_Var21[2]._M_next != 0.008726646))))))) {
    p_Var21 = p_Var21->_M_next;
  }
  p_Var23 = std::__cxx11::list<Assimp::STransformVecInfo,std::allocator<Assimp::STransformVecInfo>>
            ::_M_create_node<Assimp::STransformVecInfo_const&>
                      ((list<Assimp::STransformVecInfo,std::allocator<Assimp::STransformVecInfo>> *)
                       p_Var22,(STransformVecInfo *)(__position._M_node + 1));
  std::__detail::_List_node_base::_M_hook(&p_Var23->super__List_node_base);
  p_Var22[1]._M_next = (_List_node_base *)((long)&(p_Var22[1]._M_next)->_M_next + 1);
  std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>::
  _M_erase((list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_> *)p_Var22,
           __position);
LAB_00161589:
  if (bVar16) {
    p_Var21 = p_Var22->_M_next;
    if (p_Var21 == p_Var22) {
      local_64c = 0;
    }
    else {
      uVar31 = 0;
      local_64c = 0;
      do {
        uVar18 = *(uint *)&p_Var21[3]._M_next;
        if (uVar18 != uVar31 && uVar18 != 0xeeeeeeee) {
          p_Var24 = p_Var22;
          do {
            p_Var24 = p_Var24->_M_next;
          } while (uVar18 != 0);
          if (*(int *)&p_Var24[3]._M_next == -0x11111112) {
            local_5a8 = *(ai_real *)&p_Var24[2]._M_next;
            local_5b8 = p_Var24[1];
            uVar13 = *(undefined8 *)((long)&p_Var24[2]._M_next + 4);
            uVar14 = *(undefined8 *)((long)&p_Var24[2]._M_prev + 4);
            uStack_5a4 = (uint)uVar13;
            aStack_5a0 = (aiTextureMapMode)((ulong)uVar13 >> 0x20);
            aStack_59c = (aiTextureMapMode)uVar14;
            uStack_598 = (uint)((ulong)uVar14 >> 0x20);
            pp_Var1 = &p_Var24[3]._M_prev;
            p_Var25 = p_Var24[3]._M_prev;
            p_Var30 = p_Var24[4]._M_next;
            p_Stack_580 = p_Var24[4]._M_prev;
            p_Stack_590 = (_List_node_base *)&p_Stack_590;
            local_588 = (_List_node_base *)&p_Stack_590;
            if (p_Var25 != (_List_node_base *)pp_Var1) {
              *(_List_node_base ***)
               &((_List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_> *)
                &p_Var30->_M_next)->_M_impl = &p_Stack_590;
              p_Var25->_M_prev = (_List_node_base *)&p_Stack_590;
              p_Var24[4]._M_next = (_List_node_base *)pp_Var1;
              p_Var24[3]._M_prev = (_List_node_base *)pp_Var1;
              p_Var24[4]._M_prev = (_List_node_base *)0x0;
              p_Stack_590 = p_Var25;
              local_588 = p_Var30;
            }
            *(undefined4 *)&p_Var24[2]._M_next = *(undefined4 *)&p_Var21[2]._M_next;
            p_Var25 = p_Var21[1]._M_prev;
            p_Var24[1]._M_next = p_Var21[1]._M_next;
            p_Var24[1]._M_prev = p_Var25;
            uVar13 = *(undefined8 *)((long)&p_Var21[2]._M_prev + 4);
            *(undefined8 *)((long)&p_Var24[2]._M_next + 4) =
                 *(undefined8 *)((long)&p_Var21[2]._M_next + 4);
            *(undefined8 *)((long)&p_Var24[2]._M_prev + 4) = uVar13;
            std::__cxx11::list<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>::
            _M_move_assign((list<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_> *)
                           pp_Var1,&p_Var21[3]._M_prev);
            *(ai_real *)&p_Var21[2]._M_next = local_5a8;
            p_Var21[1]._M_next = local_5b8._M_next;
            p_Var21[1]._M_prev = local_5b8._M_prev;
            *(ulong *)((long)&p_Var21[2]._M_next + 4) = CONCAT44(aStack_5a0,uStack_5a4);
            *(ulong *)((long)&p_Var21[2]._M_prev + 4) = CONCAT44(uStack_598,aStack_59c);
            std::__cxx11::list<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>::
            _M_move_assign((list<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_> *)
                           &p_Var21[3]._M_prev);
            p_Var24 = p_Stack_590;
            while (p_Var24 != (_List_node_base *)&p_Stack_590) {
              p_Var25 = *(_List_node_base **)
                         &((_List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>
                            *)&p_Var24->_M_next)->_M_impl;
              operator_delete(p_Var24);
              p_Var24 = p_Var25;
            }
            if (*(uint *)&p_Var21[3]._M_next == local_64c) {
              local_64c = uVar31;
            }
          }
          else {
            pLVar20 = DefaultLogger::get();
            Logger::error(pLVar20,
                          "Channel mismatch, can\'t compute all transformations properly [design bug]"
                         );
          }
        }
        uVar31 = uVar31 + 1;
        p_Var21 = p_Var21->_M_next;
      } while (p_Var21 != p_Var22);
    }
    lVar35 = 0;
    do {
      acStack_5f8[lVar35] = ppaVar2[lVar35] == (aiVector3D *)0x0;
      lVar35 = lVar35 + 1;
    } while (lVar35 != 8);
    for (p_Var21 = p_Var22->_M_next; p_Var21 != p_Var22; p_Var21 = p_Var21->_M_next) {
      acStack_5f8[*(uint *)((long)&p_Var21[2]._M_next + 4)] = '\x01';
    }
    lVar35 = 0;
    do {
      if (acStack_5f8[lVar35] == '\0') {
        local_5b8 = (_List_node_base)(ZEXT816(0x3f8000003f800000) << 0x40);
        local_5a8 = 0.0;
        uStack_5a4 = 0;
        aStack_5a0 = aiTextureMapMode_Wrap;
        aStack_59c = aiTextureMapMode_Wrap;
        uStack_598 = 0xeeeeeeee;
        p_Stack_580 = (_List_node_base *)0x0;
        p_Stack_590 = (_List_node_base *)&p_Stack_590;
        local_588 = (_List_node_base *)&p_Stack_590;
        std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>::
        _M_insert<Assimp::STransformVecInfo>
                  ((list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_> *)
                   p_Var22,(iterator)p_Var22,(STransformVecInfo *)&local_5b8);
        p_Var21 = p_Stack_590;
        while (p_Var21 != (_List_node_base *)&p_Stack_590) {
          p_Var24 = *(_List_node_base **)
                     &((_List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_> *)
                      &p_Var21->_M_next)->_M_impl;
          operator_delete(p_Var21);
          p_Var21 = p_Var24;
        }
        *(int *)((long)&p_Var22->_M_prev[2]._M_next + 4) = (int)lVar35;
      }
      lVar35 = lVar35 + 1;
    } while (lVar35 != 8);
    uVar31 = *(uint *)&p_Var22[1]._M_next;
    if (8 < uVar31) {
      bVar16 = DefaultLogger::isNullLogger();
      uVar31 = 8;
      if (!bVar16) {
        pLVar20 = DefaultLogger::get();
        local_5fc = *(uint *)&p_Var22[1]._M_next;
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<unsigned_int>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_5b8,&local_5fc);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_5b8," UV channels required but just ",0x1f);
        std::ostream::operator<<((ostream *)&local_5b8,8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_5b8," available",10);
        std::__cxx11::stringbuf::str();
        Logger::error(pLVar20,local_5f0);
        if (local_5f0 != local_5e0) {
          operator_delete(local_5f0);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_5b8);
        std::ios_base::~ios_base(local_548);
      }
    }
    local_588 = (_List_node_base *)paVar8->mTextureCoords[6];
    p_Stack_580 = (_List_node_base *)paVar8->mTextureCoords[7];
    uStack_598 = (uint)paVar8->mTextureCoords[4];
    uStack_594 = (undefined4)((ulong)paVar8->mTextureCoords[4] >> 0x20);
    p_Stack_590 = (_List_node_base *)paVar8->mTextureCoords[5];
    local_5a8 = SUB84(paVar8->mTextureCoords[2],0);
    uStack_5a4 = (uint)((ulong)paVar8->mTextureCoords[2] >> 0x20);
    aStack_5a0 = (aiTextureMapMode)paVar8->mTextureCoords[3];
    aStack_59c = (aiTextureMapMode)((ulong)paVar8->mTextureCoords[3] >> 0x20);
    local_5b8._M_next = (_List_node_base *)ppaVar2[0];
    local_5b8._M_prev = (_List_node_base *)ppaVar2[1];
    if (p_Var22[1]._M_next != (_List_node_base *)0x0) {
      p_Var24 = (_List_node_base *)0x0;
      p_Var21 = p_Var22;
      do {
        p_Var21 = p_Var21->_M_next;
        uVar18 = (uint)p_Var24;
        if (uVar18 < uVar31) {
          bVar16 = DefaultLogger::isNullLogger();
          if (!bVar16) {
            pcVar34 = "-c";
            if (*(int *)&p_Var21[2]._M_prev == 2) {
              pcVar34 = "-m";
            }
            if (*(int *)&p_Var21[2]._M_prev == 0) {
              pcVar34 = "-w";
            }
            iVar19 = *(int *)((long)&p_Var21[2]._M_prev + 4);
            pcVar29 = "-c";
            if (iVar19 == 2) {
              pcVar29 = "-m";
            }
            if (iVar19 == 0) {
              pcVar29 = "-w";
            }
            snprintf((char *)local_438,0x400,
                     "Mesh %u, channel %u: t(%.3f,%.3f), s(%.3f,%.3f), r(%.3f), %s%s",
                     (double)*(float *)&p_Var21[1]._M_next,
                     SUB84((double)*(float *)((long)&p_Var21[1]._M_next + 4),0),
                     SUB84((double)*(float *)&p_Var21[1]._M_prev,0),
                     SUB84((double)*(float *)((long)&p_Var21[1]._M_prev + 4),0),
                     (double)(*(float *)&p_Var21[2]._M_next * 57.29578),uVar36,p_Var24,pcVar34,
                     pcVar29);
            pLVar20 = DefaultLogger::get();
            Logger::info(pLVar20,(char *)local_438);
          }
          p_Var25 = p_Var21;
          p_Var30 = p_Var24;
          if (ppaVar2[(long)p_Var24] == (aiVector3D *)0x0) {
            uVar38 = (ulong)paVar8->mNumVertices;
            paVar26 = (aiVector3D *)operator_new__(uVar38 * 0xc);
LAB_00161a58:
            if (uVar38 != 0) {
              memset(paVar26,0,((uVar38 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
            }
            ppaVar2[(long)p_Var24] = paVar26;
          }
          else {
            do {
              p_Var25 = p_Var25->_M_next;
              uVar28 = (int)p_Var30 + 1;
              if (uVar31 <= uVar28) goto LAB_00161a3f;
              p_Var30 = (_List_node_base *)(ulong)uVar28;
            } while (*(uint *)((long)&p_Var25[2]._M_next + 4) != uVar18);
            p_Var25 = p_Var22->_M_next;
LAB_00161a3f:
            if (p_Var25 == p_Var22->_M_next) {
              uVar38 = (ulong)paVar8->mNumVertices;
              paVar26 = (aiVector3D *)operator_new__(uVar38 * 0xc);
              goto LAB_00161a58;
            }
          }
          paVar26 = *(aiVector3D **)
                     ((long)&(((STransformVecInfo *)&local_5b8)->super_aiUVTransform).mTranslation +
                     (ulong)*(uint *)((long)&p_Var21[2]._M_next + 4) * 8);
          if (paVar26 == (aiVector3D *)0x0) {
            __assert_fail("__null != src",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/PostProcessing/TextureTransform.cpp"
                          ,0x1fe,"virtual void Assimp::TextureTransformStep::Execute(aiScene *)");
          }
          __dest = ppaVar2[(long)p_Var24];
          if (__dest != paVar26) {
            memcpy(__dest,paVar26,(ulong)paVar8->mNumVertices * 0xc);
          }
          uVar28 = paVar8->mNumVertices;
          fVar51 = *(float *)&p_Var21[1]._M_prev;
          fVar53 = *(float *)((long)&p_Var21[1]._M_prev + 4);
          if (((((fVar51 != 1.0) || (NAN(fVar51))) ||
               ((fVar53 != 1.0 || ((NAN(fVar53) || (*(float *)&p_Var21[1]._M_next != 0.0)))))) ||
              (NAN(*(float *)&p_Var21[1]._M_next))) ||
             (((fVar43 = *(float *)((long)&p_Var21[1]._M_next + 4), fVar43 != 0.0 || (NAN(fVar43)))
              || (0.008726646 < *(float *)&p_Var21[2]._M_next ||
                  *(float *)&p_Var21[2]._M_next == 0.008726646)))) {
            fVar43 = *(float *)&p_Var21[2]._M_next;
            fVar44 = 0.0;
            fVar54 = 1.0;
            fVar40 = 0.0;
            if (0.008726646 < fVar43) {
              fVar54 = cosf(fVar43);
              fVar40 = sinf(fVar43);
              fVar44 = -fVar40;
            }
            iVar17 = iVar17 + 1;
            fVar43 = fVar53 * 0.0 + 0.0;
            fVar45 = fVar51 * 0.0 + 0.0 + 0.0;
            fVar49 = fVar45 * 0.0 + fVar43 * 0.0 + 1.0;
            if ((ulong)uVar28 != 0) {
              fVar41 = *(float *)&p_Var21[1]._M_next + 0.0;
              fVar51 = fVar51 + 0.0;
              fVar53 = fVar53 + 0.0;
              fVar47 = *(float *)((long)&p_Var21[1]._M_next + 4) + 0.0;
              fVar48 = fVar54 * fVar51 + fVar43 * fVar40 + 0.0;
              fVar46 = fVar44 * fVar51 + fVar43 * fVar54 + 0.0;
              fVar52 = fVar51 * 0.0 + fVar43 * 0.0 + 0.5;
              fVar51 = fVar40 * fVar53 + fVar54 * fVar45 + 0.0;
              fVar50 = fVar53 * fVar54 + fVar44 * fVar45 + 0.0;
              fVar53 = fVar45 * 0.0 + fVar53 * 0.0 + 0.5;
              fVar55 = fVar54 * fVar45 + fVar43 * fVar40 + 0.0;
              fVar54 = fVar44 * fVar45 + fVar43 * fVar54 + 0.0;
              fVar40 = fVar52 * 0.0;
              fVar43 = fVar46 * 0.0 + fVar48 + fVar40;
              fVar40 = fVar48 * 0.0 + fVar46 + fVar40;
              fVar52 = fVar48 * -0.5 + fVar46 * -0.5 + fVar52;
              fVar45 = fVar53 * 0.0;
              fVar44 = fVar50 * 0.0 + fVar51 + fVar45;
              fVar45 = fVar51 * 0.0 + fVar50 + fVar45;
              fVar53 = fVar51 * -0.5 + fVar50 * -0.5 + fVar53;
              fVar50 = fVar49 * 0.0;
              fVar48 = fVar54 * 0.0 + fVar55 + fVar50;
              fVar50 = fVar55 * 0.0 + fVar54 + fVar50;
              fVar49 = fVar55 * -0.5 + fVar54 * -0.5 + fVar49;
              fVar51 = fVar52 * 0.0;
              fVar54 = fVar53 * 0.0;
              fVar46 = fVar49 * 0.0;
              lVar35 = 0;
              do {
                fVar55 = *(float *)((long)&__dest->x + lVar35);
                fVar3 = *(float *)((long)&__dest->y + lVar35);
                fVar42 = fVar55 * (fVar50 * 0.0 + fVar48 + fVar46) +
                         fVar3 * (fVar48 * 0.0 + fVar50 + fVar46) +
                         fVar50 * fVar47 + fVar41 * fVar48 + fVar49;
                *(ulong *)((long)&__dest->x + lVar35) =
                     CONCAT44((fVar45 * 0.0 + fVar44 + fVar54) * fVar55 +
                              (fVar44 * 0.0 + fVar45 + fVar54) * fVar3 +
                              fVar45 * fVar47 + fVar41 * fVar44 + fVar53,
                              (fVar40 * 0.0 + fVar43 + fVar51) * fVar55 +
                              (fVar43 * 0.0 + fVar40 + fVar51) * fVar3 +
                              fVar40 * fVar47 + fVar41 * fVar43 + fVar52);
                *(float *)((long)&__dest->x + lVar35) =
                     *(float *)((long)&__dest->x + lVar35) / fVar42;
                *(float *)((long)&__dest->y + lVar35) =
                     *(float *)((long)&__dest->y + lVar35) / fVar42;
                *(undefined4 *)((long)&__dest->z + lVar35) = 0;
                lVar35 = lVar35 + 0xc;
              } while ((ulong)uVar28 * 0xc != lVar35);
            }
          }
          UpdateUVIndex((list<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_> *)
                        &p_Var21[3]._M_prev,uVar18);
        }
        else {
          UpdateUVIndex((list<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_> *)
                        &p_Var21[3]._M_prev,local_64c);
        }
        p_Var24 = (_List_node_base *)(ulong)(uVar18 + 1);
      } while (p_Var24 < p_Var22[1]._M_next);
    }
  }
LAB_00161f06:
  uVar36 = uVar36 + 1;
  if (pScene->mNumMeshes <= uVar36) goto LAB_00161f39;
  goto LAB_00161367;
}

Assistant:

void TextureTransformStep::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("TransformUVCoordsProcess begin");


    /*  We build a per-mesh list of texture transformations we'll need
     *  to apply. To achieve this, we iterate through all materials,
     *  find all textures and get their transformations and UV indices.
     *  Then we search for all meshes using this material.
     */
    typedef std::list<STransformVecInfo> MeshTrafoList;
    std::vector<MeshTrafoList> meshLists(pScene->mNumMeshes);

    for (unsigned int i = 0; i < pScene->mNumMaterials;++i) {

        aiMaterial* mat = pScene->mMaterials[i];
        for (unsigned int a = 0; a < mat->mNumProperties;++a)   {

            aiMaterialProperty* prop = mat->mProperties[a];
            if (!::strcmp( prop->mKey.data, "$tex.file"))   {
                STransformVecInfo info;

                // Setup a shortcut structure to allow for a fast updating
                // of the UV index later
                TTUpdateInfo update;
                update.mat = (aiMaterial*) mat;
                update.semantic = prop->mSemantic;
                update.index = prop->mIndex;

                // Get textured properties and transform
                for (unsigned int a2 = 0; a2 < mat->mNumProperties;++a2)  {
                    aiMaterialProperty* prop2 = mat->mProperties[a2];
                    if (prop2->mSemantic != prop->mSemantic || prop2->mIndex != prop->mIndex) {
                        continue;
                    }

                    if ( !::strcmp( prop2->mKey.data, "$tex.uvwsrc")) {
                        info.uvIndex = *((int*)prop2->mData);

                        // Store a direct pointer for later use
                        update.directShortcut = (unsigned int*) prop2->mData;
                    }

                    else if ( !::strcmp( prop2->mKey.data, "$tex.mapmodeu")) {
                        info.mapU = *((aiTextureMapMode*)prop2->mData);
                    }
                    else if ( !::strcmp( prop2->mKey.data, "$tex.mapmodev")) {
                        info.mapV = *((aiTextureMapMode*)prop2->mData);
                    }
                    else if ( !::strcmp( prop2->mKey.data, "$tex.uvtrafo"))  {
                        // ValidateDS should check this
                        ai_assert(prop2->mDataLength >= 20);
                        ::memcpy(&info.mTranslation.x,prop2->mData,sizeof(float)*5);

                        // Directly remove this property from the list
                        mat->mNumProperties--;
                        for (unsigned int a3 = a2; a3 < mat->mNumProperties;++a3) {
                            mat->mProperties[a3] = mat->mProperties[a3+1];
                        }

                        delete prop2;

                        // Warn: could be an underflow, but this does not invoke undefined behaviour
                        --a2;
                    }
                }

                // Find out which transformations are to be evaluated
                if (!(configFlags & AI_UVTRAFO_ROTATION)) {
                    info.mRotation = 0.f;
                }
                if (!(configFlags & AI_UVTRAFO_SCALING)) {
                    info.mScaling = aiVector2D(1.f,1.f);
                }
                if (!(configFlags & AI_UVTRAFO_TRANSLATION)) {
                    info.mTranslation = aiVector2D(0.f,0.f);
                }

                // Do some preprocessing
                PreProcessUVTransform(info);
                info.uvIndex = std::min(info.uvIndex,AI_MAX_NUMBER_OF_TEXTURECOORDS -1u);

                // Find out whether this material is used by more than
                // one mesh. This will make our task much, much more difficult!
                unsigned int cnt = 0;
                for (unsigned int n = 0; n < pScene->mNumMeshes;++n)    {
                    if (pScene->mMeshes[n]->mMaterialIndex == i)
                        ++cnt;
                }

                if (!cnt)
                    continue;
                else if (1 != cnt)  {
                    // This material is referenced by more than one mesh!
                    // So we need to make sure the UV index for the texture
                    // is identical for each of it ...
                    info.lockedPos = AI_TT_UV_IDX_LOCK_TBD;
                }

                // Get all corresponding meshes
                for (unsigned int n = 0; n < pScene->mNumMeshes;++n)    {
                    aiMesh* mesh = pScene->mMeshes[n];
                    if (mesh->mMaterialIndex != i || !mesh->mTextureCoords[0])
                        continue;

                    unsigned int uv = info.uvIndex;
                    if (!mesh->mTextureCoords[uv])  {
                        // If the requested UV index is not available, take the first one instead.
                        uv = 0;
                    }

                    if (mesh->mNumUVComponents[info.uvIndex] >= 3){
                        ASSIMP_LOG_WARN("UV transformations on 3D mapping channels are not supported");
                        continue;
                    }

                    MeshTrafoList::iterator it;

                    // Check whether we have this transform setup already
                    for (it = meshLists[n].begin();it != meshLists[n].end(); ++it)  {

                        if ((*it) == info && (*it).uvIndex == uv)   {
                            (*it).updateList.push_back(update);
                            break;
                        }
                    }

                    if (it == meshLists[n].end())   {
                        meshLists[n].push_back(info);
                        meshLists[n].back().uvIndex = uv;
                        meshLists[n].back().updateList.push_back(update);
                    }
                }
            }
        }
    }

    char buffer[1024]; // should be sufficiently large
    unsigned int outChannels = 0, inChannels = 0, transformedChannels = 0;

    // Now process all meshes. Important: we don't remove unreferenced UV channels.
    // This is a job for the RemoveUnreferencedData-Step.
    for (unsigned int q = 0; q < pScene->mNumMeshes;++q)    {

        aiMesh* mesh = pScene->mMeshes[q];
        MeshTrafoList& trafo =  meshLists[q];

        inChannels += mesh->GetNumUVChannels();

        if (!mesh->mTextureCoords[0] || trafo.empty() ||  (trafo.size() == 1 && trafo.begin()->IsUntransformed())) {
            outChannels += mesh->GetNumUVChannels();
            continue;
        }

        // Move untransformed UV channels to the first position in the list ....
        // except if we need a new locked index which should be as small as possible
        bool veto = false, need = false;
        unsigned int cnt = 0;
        unsigned int untransformed = 0;

        MeshTrafoList::iterator it,it2;
        for (it = trafo.begin();it != trafo.end(); ++it,++cnt)  {

            if (!(*it).IsUntransformed()) {
                need = true;
            }

            if ((*it).lockedPos == AI_TT_UV_IDX_LOCK_TBD)   {
                // Lock this index and make sure it won't be changed
                (*it).lockedPos = cnt;
                veto = true;
                continue;
            }

            if (!veto && it != trafo.begin() && (*it).IsUntransformed())    {
                for (it2 = trafo.begin();it2 != it; ++it2) {
                    if (!(*it2).IsUntransformed())
                        break;
                }
                trafo.insert(it2,*it);
                trafo.erase(it);
                break;
            }
        }
        if (!need)
            continue;

        // Find all that are not at their 'locked' position and move them to it.
        // Conflicts are possible but quite unlikely.
        cnt = 0;
        for (it = trafo.begin();it != trafo.end(); ++it,++cnt) {
            if ((*it).lockedPos != AI_TT_UV_IDX_LOCK_NONE && (*it).lockedPos != cnt) {
                it2 = trafo.begin();unsigned int t = 0;
                while (t != (*it).lockedPos)
                    ++it2;

                if ((*it2).lockedPos != AI_TT_UV_IDX_LOCK_NONE) {
                    ASSIMP_LOG_ERROR("Channel mismatch, can't compute all transformations properly [design bug]");
                    continue;
                }

                std::swap(*it2,*it);
                if ((*it).lockedPos == untransformed)
                    untransformed = cnt;
            }
        }

        // ... and add dummies for all unreferenced channels
        // at the end of the list
        bool ref[AI_MAX_NUMBER_OF_TEXTURECOORDS];
        for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_TEXTURECOORDS;++n)
            ref[n] = (!mesh->mTextureCoords[n] ? true : false);

        for (it = trafo.begin();it != trafo.end(); ++it)
            ref[(*it).uvIndex] = true;

        for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_TEXTURECOORDS;++n) {
            if (ref[n])
                continue;
            trafo.push_back(STransformVecInfo());
            trafo.back().uvIndex = n;
        }

        // Then check whether this list breaks the channel limit.
        // The unimportant ones are at the end of the list, so
        // it shouldn't be too worse if we remove them.
        unsigned int size = (unsigned int)trafo.size();
        if (size > AI_MAX_NUMBER_OF_TEXTURECOORDS) {

            if (!DefaultLogger::isNullLogger()) {
                ASSIMP_LOG_ERROR_F(static_cast<unsigned int>(trafo.size()), " UV channels required but just ", 
                    AI_MAX_NUMBER_OF_TEXTURECOORDS, " available");
            }
            size = AI_MAX_NUMBER_OF_TEXTURECOORDS;
        }


        aiVector3D* old[AI_MAX_NUMBER_OF_TEXTURECOORDS];
        for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_TEXTURECOORDS;++n)
            old[n] = mesh->mTextureCoords[n];

        // Now continue and generate the output channels. Channels
        // that we're not going to need later can be overridden.
        it = trafo.begin();
        for (unsigned int n = 0; n < trafo.size();++n,++it) {

            if (n >= size)  {
                // Try to use an untransformed channel for all channels we threw over board
                UpdateUVIndex((*it).updateList,untransformed);
                continue;
            }

            outChannels++;

            // Write to the log
            if (!DefaultLogger::isNullLogger()) {
                ::ai_snprintf(buffer,1024,"Mesh %u, channel %u: t(%.3f,%.3f), s(%.3f,%.3f), r(%.3f), %s%s",
                    q,n,
                    (*it).mTranslation.x,
                    (*it).mTranslation.y,
                    (*it).mScaling.x,
                    (*it).mScaling.y,
                    AI_RAD_TO_DEG( (*it).mRotation),
                    MappingModeToChar ((*it).mapU),
                    MappingModeToChar ((*it).mapV));

                ASSIMP_LOG_INFO(buffer);
            }

            // Check whether we need a new buffer here
            if (mesh->mTextureCoords[n])    {

                it2 = it;++it2;
                for (unsigned int m = n+1; m < size;++m, ++it2) {

                    if ((*it2).uvIndex == n){
                        it2 = trafo.begin();
                        break;
                    }
                }
                if (it2 == trafo.begin()){
                    mesh->mTextureCoords[n] = new aiVector3D[mesh->mNumVertices];
                }
            }
            else mesh->mTextureCoords[n] = new aiVector3D[mesh->mNumVertices];

            aiVector3D* src = old[(*it).uvIndex];
            aiVector3D* dest, *end;
            dest = mesh->mTextureCoords[n];

            ai_assert(NULL != src);

            // Copy the data to the destination array
            if (dest != src)
                ::memcpy(dest,src,sizeof(aiVector3D)*mesh->mNumVertices);

            end = dest + mesh->mNumVertices;

            // Build a transformation matrix and transform all UV coords with it
            if (!(*it).IsUntransformed()) {
                const aiVector2D& trl = (*it).mTranslation;
                const aiVector2D& scl = (*it).mScaling;

                // fixme: simplify ..
                ++transformedChannels;
                aiMatrix3x3 matrix;

                aiMatrix3x3 m2,m3,m4,m5;

                m4.a1 = scl.x;
                m4.b2 = scl.y;

                m2.a3 = m2.b3 = 0.5f;
                m3.a3 = m3.b3 = -0.5f;

                if ((*it).mRotation > AI_TT_ROTATION_EPSILON )
                    aiMatrix3x3::RotationZ((*it).mRotation,matrix);

                m5.a3 += trl.x; m5.b3 += trl.y;
                matrix = m2 * m4 * matrix * m3 * m5;

                for (src = dest; src != end; ++src) { /* manual homogenious divide */
                    src->z = 1.f;
                    *src = matrix * *src;
                    src->x /= src->z;
                    src->y /= src->z;
                    src->z = 0.f;
                }
            }

            // Update all UV indices
            UpdateUVIndex((*it).updateList,n);
        }
    }

    // Print some detailed statistics into the log
    if (!DefaultLogger::isNullLogger()) {

        if (transformedChannels)    {
            ASSIMP_LOG_INFO_F("TransformUVCoordsProcess end: ", outChannels, " output channels (in: ", inChannels, ", modified: ", transformedChannels,")");
        } else {
            ASSIMP_LOG_DEBUG("TransformUVCoordsProcess finished");
        }
    }
}